

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2scan_x.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double in_XMM1_Qa;
  double x;
  double in_XMM2_Qa;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM4_Db;
  double in_XMM7_Qa;
  double in_stack_00000008;
  double t239;
  double t236;
  double t235;
  double t234;
  double t230;
  double t229;
  double t227;
  double t226;
  double t225;
  double t224;
  double t223;
  double t221;
  double t220;
  double t218;
  double t215;
  double t214;
  double t209;
  double t207;
  double t205;
  double t203;
  double t201;
  double t199;
  double t198;
  double t197;
  double t196;
  double t194;
  double t193;
  double t192;
  double t191;
  double t190;
  double t189;
  double t188;
  double t187;
  double t186;
  double t183;
  double t182;
  double t180;
  double t178;
  double t177;
  double t176;
  double t172;
  double t168;
  double t167;
  double t166;
  double t165;
  double t164;
  double t160;
  double t156;
  double t155;
  double t153;
  double t152;
  double t151;
  double t150;
  double t149;
  double t148;
  double t147;
  double t145;
  double t144;
  double t143;
  double t142;
  double t140;
  double t139;
  double t138;
  double t135;
  double t134;
  double t133;
  double t129;
  double t128;
  double t126;
  double t125;
  double t124;
  double t121;
  double t120;
  double t119;
  double t117;
  double t116;
  double t114;
  double t111;
  double t110;
  double t105;
  double t103;
  double t101;
  double t99;
  double t97;
  double t95;
  double t94;
  double t93;
  double t92;
  double t90;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t84;
  double t83;
  double t82;
  double t79;
  double t76;
  double t74;
  double t72;
  double t71;
  double t70;
  double t66;
  double t62;
  double t61;
  double t60;
  double t59;
  double t56;
  double t52;
  double t45;
  double t44;
  double t42;
  double t41;
  double t40;
  double t39;
  double t38;
  double t28;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t12;
  double t11;
  double t8;
  double t7;
  double t2;
  double t123;
  double t122;
  double t78;
  double t58;
  double t57;
  double t48;
  double t47;
  double t46;
  double t37;
  double t36;
  double t35;
  double t32;
  double t30;
  double t6;
  double t34;
  double t33;
  double t31;
  double t4;
  double t3;
  
  dVar9 = (double)CONCAT44(in_XMM4_Db,in_XMM4_Da);
  dVar1 = 1.0 / (in_XMM0_Qa + in_XMM1_Qa);
  dVar2 = (double)(-(ulong)((in_XMM0_Qa + in_XMM0_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar3 = (double)(-(ulong)((in_XMM1_Qa + in_XMM1_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar4 = piecewise_functor_5<double>
                    ((bool)(-(dVar2 != 0.0) & 1),-0.999999999999999,(bool)(-(dVar3 != 0.0) & 1),
                     0.999999999999999,(in_XMM0_Qa - in_XMM1_Qa) * dVar1);
  dVar5 = safe_math::cbrt<double>(1.04011885520049e-317);
  dVar6 = safe_math::cbrt<double>(1.04014405254843e-317);
  dVar4 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(dVar4 + 1.0 <= 1e-15) & 0x3ff0000000000000) != 0.0)
                           & 1),dVar5 * 1e-15,dVar6 * (dVar4 + 1.0));
  dVar6 = safe_math::cbrt<double>(1.04021322173885e-317);
  dVar7 = safe_math::cbrt<double>(1.04027250961635e-317);
  dVar8 = safe_math::exp<double>(1.04034908979145e-317);
  dVar12 = 1.0 / (dVar7 * dVar7 * in_XMM0_Qa * in_XMM0_Qa);
  dVar13 = (1.0 - 0.065 / (((dVar8 * -0.12082102608751867 + 0.12345679012345678) *
                            1.8171205928321397 * in_XMM2_Qa * 0.21733691746289932 * dVar12) / 24.0 +
                          0.065)) * 0.065;
  x = (in_XMM7_Qa * (1.0 / (dVar7 * dVar7 * in_XMM0_Qa)) + in_XMM2_Qa * dVar12 * -0.125) *
      (1.0 / (in_XMM2_Qa * 0.001 * dVar12 * 0.125 + 4.557799872345597));
  piecewise_functor_3<double>
            ((bool)(-((double)(-(ulong)(0.0 < x) & 0x3ff0000000000000) != 0.0) & 1),0.0,x);
  dVar7 = safe_math::exp<double>(1.04079523106965e-317);
  dVar12 = (double)(-(ulong)(2.5 < x) & 0x3ff0000000000000);
  dVar8 = piecewise_functor_3<double>((bool)(-(dVar12 != 0.0) & 1),2.5,x);
  dVar10 = dVar8 * dVar8;
  dVar11 = dVar10 * dVar10;
  piecewise_functor_3<double>((bool)(-(dVar12 != 0.0) & 1),x,2.5);
  dVar12 = safe_math::exp<double>(1.04099878611574e-317);
  dVar7 = piecewise_functor_5<double>
                    ((bool)(-((double)(-(ulong)(x <= 0.0) & 0x3ff0000000000000) != 0.0) & 1),dVar7,
                     (bool)(-((double)(-(ulong)(x <= 2.5) & 0x3ff0000000000000) != 0.0) & 1),
                     dVar11 * dVar10 * 0.234528941479 +
                     dVar11 * dVar8 * -0.887998041597 +
                     dVar11 * 1.45129704449 +
                     dVar10 * dVar8 * -0.663086601049 + dVar10 * -0.4445555 + dVar8 * -0.667 + 1.0 +
                     dVar11 * -0.023185843322 * dVar10 * dVar8,dVar12 * -1.24);
  safe_math::sqrt<double>(1.0412107402778e-317);
  safe_math::sqrt<double>(1.04122210378766e-317);
  safe_math::sqrt<double>(1.04128682638726e-317);
  dVar8 = safe_math::exp<double>(1.04131054153826e-317);
  dVar4 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(in_XMM0_Qa <= 1e-11) & 0x3ff0000000000000) != 0.0) &
                           1),0.0,
                     dVar4 * 0.9847450218426964 * -0.375 *
                     dVar6 * (dVar7 * (0.174 - dVar13) + dVar13 + 1.0) * (1.0 - dVar8));
  dVar1 = piecewise_functor_5<double>
                    ((bool)(-(dVar3 != 0.0) & 1),-0.999999999999999,(bool)(-(dVar2 != 0.0) & 1),
                     0.999999999999999,-(in_XMM0_Qa - in_XMM1_Qa) * dVar1);
  dVar2 = safe_math::cbrt<double>(1.04152051943774e-317);
  dVar1 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(dVar1 + 1.0 <= 1e-15) & 0x3ff0000000000000) != 0.0)
                           & 1),dVar5 * 1e-15,dVar2 * (dVar1 + 1.0));
  dVar2 = safe_math::cbrt<double>(1.04163366047064e-317);
  dVar3 = safe_math::exp<double>(1.04169838307025e-317);
  dVar5 = 1.0 / (dVar2 * dVar2 * in_XMM1_Qa * in_XMM1_Qa);
  dVar12 = (1.0 - 0.065 / (((dVar3 * -0.12082102608751867 + 0.12345679012345678) *
                            1.8171205928321397 * dVar9 * 0.21733691746289932 * dVar5) / 24.0 + 0.065
                          )) * 0.065;
  dVar8 = (in_stack_00000008 * (1.0 / (dVar2 * dVar2 * in_XMM1_Qa)) + dVar9 * dVar5 * -0.125) *
          (1.0 / (dVar9 * 0.001 * dVar5 * 0.125 + 4.557799872345597));
  piecewise_functor_3<double>
            ((bool)(-((double)(-(ulong)(0.0 < dVar8) & 0x3ff0000000000000) != 0.0) & 1),0.0,dVar8);
  dVar9 = safe_math::exp<double>(1.04210944568759e-317);
  dVar2 = (double)(-(ulong)(2.5 < dVar8) & 0x3ff0000000000000);
  dVar3 = piecewise_functor_3<double>(dVar2 != 0.0,2.5,dVar8);
  dVar5 = dVar3 * dVar3;
  dVar7 = dVar5 * dVar5;
  piecewise_functor_3<double>(dVar2 != 0.0,dVar8,2.5);
  dVar2 = safe_math::exp<double>(1.04230114315817e-317);
  dVar9 = piecewise_functor_5<double>
                    ((double)(-(ulong)(dVar8 <= 0.0) & 0x3ff0000000000000) != 0.0,dVar9,
                     (double)(-(ulong)(dVar8 <= 2.5) & 0x3ff0000000000000) != 0.0,
                     -(dVar7 * 0.023185843322) * dVar5 * dVar3 +
                     dVar7 * dVar5 * 0.234528941479 +
                     dVar7 * dVar3 * -0.887998041597 +
                     dVar7 * 1.45129704449 +
                     dVar5 * dVar3 * -0.663086601049 + dVar5 * -0.4445555 + dVar3 * -0.667 + 1.0,
                     dVar2 * -1.24);
  safe_math::sqrt<double>(1.04252199050186e-317);
  safe_math::sqrt<double>(1.04257683178855e-317);
  dVar2 = safe_math::exp<double>(1.04259659441439e-317);
  dVar9 = piecewise_functor_3<double>
                    ((double)(-(ulong)(in_XMM1_Qa <= 1e-11) & 0x3ff0000000000000) != 0.0,0.0,
                     dVar1 * 0.9847450218426964 * -0.375 *
                     dVar6 * (dVar9 * (0.174 - dVar12) + dVar12 + 1.0) * (1.0 - dVar2));
  *in_RDI = dVar4 + dVar9;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    (void)(sigma_ab);
    (void)(lapl_a);
    (void)(lapl_b);
    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_pi;
    constexpr double t31 = constants::m_cbrt_6;
    constexpr double t33 = constants::m_pi_sq;
    constexpr double t34 = constants::m_cbrt_pi_sq;
    constexpr double t6 = t3 / t4;
    constexpr double t30 = 0.2e2 / 0.27e2 + 0.5e1 / 0.3e1 * eta;
    constexpr double t32 = t31 * t31;
    constexpr double t35 = t34 * t33;
    constexpr double t36 = 0.1e1 / t35;
    constexpr double t37 = t32 * t36;
    constexpr double t46 = dp2 * dp2;
    constexpr double t47 = t46 * t46;
    constexpr double t48 = 0.1e1 / t47;
    constexpr double t57 = t34 * t34;
    constexpr double t58 = 0.1e1 / t57;
    constexpr double t78 = 0.3e1 / 0.1e2 * t32 * t57;
    constexpr double t122 = 0.1e1 / t34;
    constexpr double t123 = t32 * t122;


    const double t2 = rho_a <= dens_tol;
    const double t7 = rho_a + rho_b;
    const double t8 = 0.1e1 / t7;
    const double t11 = 0.2e1 * rho_a * t8 <= zeta_tol;
    const double t12 = zeta_tol - 0.1e1;
    const double t15 = 0.2e1 * rho_b * t8 <= zeta_tol;
    const double t16 = -t12;
    const double t17 = rho_a - rho_b;
    const double t19 = piecewise_functor_5( t11, t12, t15, t16, t17 * t8 );
    const double t20 = 0.1e1 + t19;
    const double t21 = t20 <= zeta_tol;
    const double t22 = safe_math::cbrt( zeta_tol );
    const double t23 = t22 * zeta_tol;
    const double t24 = safe_math::cbrt( t20 );
    const double t26 = piecewise_functor_3( t21, t23, t24 * t20 );
    const double t27 = t6 * t26;
    const double t28 = safe_math::cbrt( t7 );
    const double t38 = sigma_aa * sigma_aa;
    const double t39 = rho_a * rho_a;
    const double t40 = t39 * t39;
    const double t41 = t40 * rho_a;
    const double t42 = safe_math::cbrt( rho_a );
    const double t44 = 0.1e1 / t42 / t41;
    const double t45 = t38 * t44;
    const double t52 = safe_math::exp( -t37 * t45 * t48 / 0.576e3 );
    const double t56 = ( -0.162742215233874e0 * t30 * t52 + 0.1e2 / 0.81e2 ) * t31;
    const double t59 = t58 * sigma_aa;
    const double t60 = t42 * t42;
    const double t61 = t60 * t39;
    const double t62 = 0.1e1 / t61;
    const double t66 = k1 + t56 * t59 * t62 / 0.24e2;
    const double t70 = k1 * ( 0.1e1 - k1 / t66 );
    const double t71 = t60 * rho_a;
    const double t72 = 0.1e1 / t71;
    const double t74 = sigma_aa * t62;
    const double t76 = tau_a * t72 - t74 / 0.8e1;
    const double t79 = eta * sigma_aa;
    const double t82 = t78 + t79 * t62 / 0.8e1;
    const double t83 = 0.1e1 / t82;
    const double t84 = t76 * t83;
    const double t85 = t84 <= 0.e0;
    const double t86 = 0.e0 < t84;
    const double t87 = piecewise_functor_3( t86, 0.0, t84 );
    const double t88 = c1 * t87;
    const double t89 = 0.1e1 - t87;
    const double t90 = 0.1e1 / t89;
    const double t92 = safe_math::exp( -t88 * t90 );
    const double t93 = t84 <= 0.25e1;
    const double t94 = 0.25e1 < t84;
    const double t95 = piecewise_functor_3( t94, 0.25e1, t84 );
    const double t97 = t95 * t95;
    const double t99 = t97 * t95;
    const double t101 = t97 * t97;
    const double t103 = t101 * t95;
    const double t105 = t101 * t97;
    const double t110 = piecewise_functor_3( t94, t84, 0.25e1 );
    const double t111 = 0.1e1 - t110;
    const double t114 = safe_math::exp( c2 / t111 );
    const double t116 = piecewise_functor_5( t85, t92, t93, 0.1e1 - 0.667e0 * t95 - 0.4445555e0 * t97 - 0.663086601049e0 * t99 + 0.145129704449e1 * t101 - 0.887998041597e0 * t103 + 0.234528941479e0 * t105 - 0.23185843322e-1 * t101 * t99, -d * t114 );
    const double t117 = 0.174e0 - t70;
    const double t119 = t116 * t117 + t70 + 0.1e1;
    const double t120 = t28 * t119;
    const double t121 = safe_math::sqrt( 0.3e1 );
    const double t124 = safe_math::sqrt( sigma_aa );
    const double t125 = t42 * rho_a;
    const double t126 = 0.1e1 / t125;
    const double t128 = t123 * t124 * t126;
    const double t129 = safe_math::sqrt( t128 );
    const double t133 = safe_math::exp( -0.98958e1 * t121 / t129 );
    const double t134 = 0.1e1 - t133;
    const double t135 = t120 * t134;
    const double t138 = piecewise_functor_3( t2, 0.0, -0.3e1 / 0.8e1 * t27 * t135 );
    const double t139 = rho_b <= dens_tol;
    const double t140 = -t17;
    const double t142 = piecewise_functor_5( t15, t12, t11, t16, t140 * t8 );
    const double t143 = 0.1e1 + t142;
    const double t144 = t143 <= zeta_tol;
    const double t145 = safe_math::cbrt( t143 );
    const double t147 = piecewise_functor_3( t144, t23, t145 * t143 );
    const double t148 = t6 * t147;
    const double t149 = sigma_bb * sigma_bb;
    const double t150 = rho_b * rho_b;
    const double t151 = t150 * t150;
    const double t152 = t151 * rho_b;
    const double t153 = safe_math::cbrt( rho_b );
    const double t155 = 0.1e1 / t153 / t152;
    const double t156 = t149 * t155;
    const double t160 = safe_math::exp( -t37 * t156 * t48 / 0.576e3 );
    const double t164 = ( -0.162742215233874e0 * t30 * t160 + 0.1e2 / 0.81e2 ) * t31;
    const double t165 = t58 * sigma_bb;
    const double t166 = t153 * t153;
    const double t167 = t166 * t150;
    const double t168 = 0.1e1 / t167;
    const double t172 = k1 + t164 * t165 * t168 / 0.24e2;
    const double t176 = k1 * ( 0.1e1 - k1 / t172 );
    const double t177 = t166 * rho_b;
    const double t178 = 0.1e1 / t177;
    const double t180 = sigma_bb * t168;
    const double t182 = tau_b * t178 - t180 / 0.8e1;
    const double t183 = eta * sigma_bb;
    const double t186 = t78 + t183 * t168 / 0.8e1;
    const double t187 = 0.1e1 / t186;
    const double t188 = t182 * t187;
    const double t189 = t188 <= 0.e0;
    const double t190 = 0.e0 < t188;
    const double t191 = piecewise_functor_3( t190, 0.0, t188 );
    const double t192 = c1 * t191;
    const double t193 = 0.1e1 - t191;
    const double t194 = 0.1e1 / t193;
    const double t196 = safe_math::exp( -t192 * t194 );
    const double t197 = t188 <= 0.25e1;
    const double t198 = 0.25e1 < t188;
    const double t199 = piecewise_functor_3( t198, 0.25e1, t188 );
    const double t201 = t199 * t199;
    const double t203 = t201 * t199;
    const double t205 = t201 * t201;
    const double t207 = t205 * t199;
    const double t209 = t205 * t201;
    const double t214 = piecewise_functor_3( t198, t188, 0.25e1 );
    const double t215 = 0.1e1 - t214;
    const double t218 = safe_math::exp( c2 / t215 );
    const double t220 = piecewise_functor_5( t189, t196, t197, 0.1e1 - 0.667e0 * t199 - 0.4445555e0 * t201 - 0.663086601049e0 * t203 + 0.145129704449e1 * t205 - 0.887998041597e0 * t207 + 0.234528941479e0 * t209 - 0.23185843322e-1 * t205 * t203, -d * t218 );
    const double t221 = 0.174e0 - t176;
    const double t223 = t220 * t221 + t176 + 0.1e1;
    const double t224 = t28 * t223;
    const double t225 = safe_math::sqrt( sigma_bb );
    const double t226 = t153 * rho_b;
    const double t227 = 0.1e1 / t226;
    const double t229 = t123 * t225 * t227;
    const double t230 = safe_math::sqrt( t229 );
    const double t234 = safe_math::exp( -0.98958e1 * t121 / t230 );
    const double t235 = 0.1e1 - t234;
    const double t236 = t224 * t235;
    const double t239 = piecewise_functor_3( t139, 0.0, -0.3e1 / 0.8e1 * t148 * t236 );


    eps = t138 + t239;

  }